

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

int randomx_blake2b_long(void *pout,size_t outlen,void *in,size_t inlen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 *__dest;
  long lVar9;
  uint uVar10;
  uint8_t outlen_bytes [4];
  uint8_t out_buffer [64];
  uint8_t in_buffer [64];
  blake2b_state blake_state;
  int local_1ac;
  uint local_1a8 [14];
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  blake2b_state local_128;
  
  iVar7 = -1;
  if (outlen >> 0x20 == 0) {
    iVar6 = (int)outlen;
    local_1ac = iVar6;
    if (outlen < 0x41) {
      iVar6 = randomx_blake2b_init(&local_128,outlen);
      if (((-1 < iVar6) && (iVar6 = randomx_blake2b_update(&local_128,&local_1ac,4), -1 < iVar6)) &&
         (iVar6 = randomx_blake2b_update(&local_128,in,inlen), -1 < iVar6)) {
        iVar7 = randomx_blake2b_final(&local_128,pout,outlen);
      }
    }
    else {
      local_1a8[0] = 0x1010040;
      local_1a8[1] = 0;
      local_1a8[2] = 0;
      local_1a8[3] = 0;
      local_1a8[4] = 0;
      local_1a8[5] = 0;
      local_1a8[6] = 0;
      local_1a8[7] = 0;
      local_1a8[8] = 0;
      local_1a8[9] = 0;
      local_1a8[10] = 0;
      local_1a8[0xb] = 0;
      local_1a8[0xc] = 0;
      local_1a8[0xd] = 0;
      uStack_170 = 0;
      lVar9 = 0;
      memset(local_128.t,0,0xb0);
      local_128.h[0] = 0x6a09e667f3bcc908;
      local_128.h[1] = 0xbb67ae8584caa73b;
      local_128.h[2] = 0x3c6ef372fe94f82b;
      local_128.h[3] = 0xa54ff53a5f1d36f1;
      local_128.h[4] = 0x510e527fade682d1;
      local_128.h[5] = 0x9b05688c2b3e6c1f;
      local_128.h[6] = 0x1f83d9abfb41bd6b;
      local_128.h[7] = 0x5be0cd19137e2179;
      do {
        uVar10 = local_1a8[lVar9 * 2 + 1];
        uVar1 = local_1a8[lVar9 * 2 + 2];
        uVar2 = local_1a8[lVar9 * 2 + 3];
        uVar3 = *(uint *)((long)local_128.h + lVar9 * 8 + 4);
        uVar5 = local_128.h[lVar9 + 1];
        uVar4 = *(uint *)((long)local_128.h + lVar9 * 8 + 0xc);
        *(uint *)(local_128.h + lVar9) = (uint)local_128.h[lVar9] ^ local_1a8[lVar9 * 2];
        *(uint *)((long)local_128.h + lVar9 * 8 + 4) = uVar3 ^ uVar10;
        *(uint *)(local_128.h + lVar9 + 1) = (uint)uVar5 ^ uVar1;
        *(uint *)((long)local_128.h + lVar9 * 8 + 0xc) = uVar4 ^ uVar2;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 8);
      local_128.outlen = 0x40;
      iVar8 = randomx_blake2b_update(&local_128,&local_1ac,4);
      iVar7 = -1;
      if (((-1 < iVar8) && (iVar8 = randomx_blake2b_update(&local_128,in,inlen), -1 < iVar8)) &&
         (iVar8 = randomx_blake2b_final(&local_128,local_1a8,0x40), -1 < iVar8)) {
        *(ulong *)((long)pout + 0x10) = CONCAT44(local_1a8[5],local_1a8[4]);
        *(ulong *)((long)pout + 0x18) = CONCAT44(local_1a8[7],local_1a8[6]);
        *(ulong *)pout = CONCAT44(local_1a8[1],local_1a8[0]);
        *(ulong *)((long)pout + 8) = CONCAT44(local_1a8[3],local_1a8[2]);
        uVar10 = iVar6 - 0x20;
        __dest = (undefined8 *)((long)pout + 0x20);
        if (0x40 < uVar10) {
          do {
            local_168 = CONCAT44(local_1a8[1],local_1a8[0]);
            uStack_160 = CONCAT44(local_1a8[3],local_1a8[2]);
            local_158 = CONCAT44(local_1a8[5],local_1a8[4]);
            uStack_150 = CONCAT44(local_1a8[7],local_1a8[6]);
            local_148 = CONCAT44(local_1a8[9],local_1a8[8]);
            uStack_140 = CONCAT44(local_1a8[0xb],local_1a8[10]);
            local_138 = CONCAT44(local_1a8[0xd],local_1a8[0xc]);
            uStack_130 = uStack_170;
            iVar6 = randomx_blake2b(local_1a8,0x40,&local_168,0x40,(void *)0x0,0);
            if (iVar6 < 0) {
              return -1;
            }
            __dest[2] = CONCAT44(local_1a8[5],local_1a8[4]);
            __dest[3] = CONCAT44(local_1a8[7],local_1a8[6]);
            *__dest = CONCAT44(local_1a8[1],local_1a8[0]);
            __dest[1] = CONCAT44(local_1a8[3],local_1a8[2]);
            uVar10 = uVar10 - 0x20;
            __dest = __dest + 4;
          } while (0x40 < uVar10);
        }
        local_168 = CONCAT44(local_1a8[1],local_1a8[0]);
        uStack_160 = CONCAT44(local_1a8[3],local_1a8[2]);
        local_158 = CONCAT44(local_1a8[5],local_1a8[4]);
        uStack_150 = CONCAT44(local_1a8[7],local_1a8[6]);
        local_148 = CONCAT44(local_1a8[9],local_1a8[8]);
        uStack_140 = CONCAT44(local_1a8[0xb],local_1a8[10]);
        local_138 = CONCAT44(local_1a8[0xd],local_1a8[0xc]);
        uStack_130 = uStack_170;
        iVar6 = randomx_blake2b(local_1a8,(ulong)uVar10,&local_168,0x40,(void *)0x0,0);
        if (-1 < iVar6) {
          memcpy(__dest,local_1a8,(ulong)uVar10);
          iVar7 = 0;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int blake2b_long(void *pout, size_t outlen, const void *in, size_t inlen) {
	uint8_t *out = (uint8_t *)pout;
	blake2b_state blake_state;
	uint8_t outlen_bytes[sizeof(uint32_t)] = { 0 };
	int ret = -1;

	if (outlen > UINT32_MAX) {
		goto fail;
	}

	/* Ensure little-endian byte order! */
	store32(outlen_bytes, (uint32_t)outlen);

#define TRY(statement)                                                         \
    do {                                                                       \
        ret = statement;                                                       \
        if (ret < 0) {                                                         \
            goto fail;                                                         \
        }                                                                      \
    } while ((void)0, 0)

	if (outlen <= BLAKE2B_OUTBYTES) {
		TRY(blake2b_init(&blake_state, outlen));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out, outlen));
	}
	else {
		uint32_t toproduce;
		uint8_t out_buffer[BLAKE2B_OUTBYTES];
		uint8_t in_buffer[BLAKE2B_OUTBYTES];
		TRY(blake2b_init(&blake_state, BLAKE2B_OUTBYTES));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES));
		memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
		out += BLAKE2B_OUTBYTES / 2;
		toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

		while (toproduce > BLAKE2B_OUTBYTES) {
			memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
			TRY(blake2b(out_buffer, BLAKE2B_OUTBYTES, in_buffer,
				BLAKE2B_OUTBYTES, NULL, 0));
			memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
			out += BLAKE2B_OUTBYTES / 2;
			toproduce -= BLAKE2B_OUTBYTES / 2;
		}

		memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
		TRY(blake2b(out_buffer, toproduce, in_buffer, BLAKE2B_OUTBYTES, NULL,
			0));
		memcpy(out, out_buffer, toproduce);
	}
fail:
	//clear_internal_memory(&blake_state, sizeof(blake_state));
	return ret;
#undef TRY
}